

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txin_txinreference.cpp
# Opt level: O0

void __thiscall TxIn_Constractor_Test::TestBody(TxIn_Constractor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  AssertHelper local_378;
  Message local_370;
  string local_368;
  Script local_348;
  string local_310;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_6;
  Message local_2d8;
  string local_2d0;
  Txid local_2b0;
  string local_290;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_5;
  Message local_258;
  uint32_t local_24c;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_4;
  Message local_230;
  uint32_t local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_3;
  TxIn txin_1;
  Message local_178;
  string local_170;
  Txid local_150;
  string local_130;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_2;
  Message local_f8;
  uint32_t local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0 [3];
  uint32_t local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  TxIn txin;
  TxIn_Constractor_Test *this_local;
  
  cfd::core::TxIn::TxIn((TxIn *)&gtest_ar.message_,&exp_txid,0,0xffffffff);
  local_b4 = cfd::core::AbstractTxIn::GetVout((AbstractTxIn *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_b0,"txin.GetVout()","exp_index",&local_b4,&exp_index);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_ec = cfd::core::AbstractTxIn::GetSequence((AbstractTxIn *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_e8,"txin.GetSequence()","exp_sequence",&local_ec,&exp_sequence
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  cfd::core::AbstractTxIn::GetTxid(&local_150,(AbstractTxIn *)&gtest_ar.message_);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_130,&local_150);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Txid::GetHex_abi_cxx11_(&local_170,&exp_txid);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_110,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_130);
  cfd::core::Txid::~Txid(&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&txin_1.super_AbstractTxIn.script_witness_.witness_stack_.
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       ._M_impl.super__Vector_impl_data + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&txin_1.super_AbstractTxIn.script_witness_.witness_stack_.
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       ._M_impl.super__Vector_impl_data + 0x10),&local_178);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&txin_1.super_AbstractTxIn.script_witness_.witness_stack_.
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       ._M_impl.super__Vector_impl_data + 0x10));
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  cfd::core::TxIn::~TxIn((TxIn *)&gtest_ar.message_);
  cfd::core::TxIn::TxIn((TxIn *)&gtest_ar_3.message_,&exp_txid,0,0xffffffff,&exp_script);
  local_224 = cfd::core::AbstractTxIn::GetVout((AbstractTxIn *)&gtest_ar_3.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_220,"txin.GetVout()","exp_index",&local_224,&exp_index);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  local_24c = cfd::core::AbstractTxIn::GetSequence((AbstractTxIn *)&gtest_ar_3.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_248,"txin.GetSequence()","exp_sequence",&local_24c,
             &exp_sequence);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  cfd::core::AbstractTxIn::GetTxid(&local_2b0,(AbstractTxIn *)&gtest_ar_3.message_);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_290,&local_2b0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Txid::GetHex_abi_cxx11_(&local_2d0,&exp_txid);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_270,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_290);
  cfd::core::Txid::~Txid(&local_2b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  cfd::core::AbstractTxIn::GetUnlockingScript(&local_348,(AbstractTxIn *)&gtest_ar_3.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_310,&local_348);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_(&local_368,&exp_script);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2f0,"txin.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_310);
  cfd::core::Script::~Script(&local_348);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_txin_txinreference.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_378,&local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  cfd::core::TxIn::~TxIn((TxIn *)&gtest_ar_3.message_);
  return;
}

Assistant:

TEST(TxIn, Constractor) {
  {
    TxIn txin(exp_txid, exp_index, exp_sequence);
    EXPECT_EQ(txin.GetVout(), exp_index);
    EXPECT_EQ(txin.GetSequence(), exp_sequence);
    EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  }

  {
    TxIn txin(exp_txid, exp_index, exp_sequence, exp_script);
    EXPECT_EQ(txin.GetVout(), exp_index);
    EXPECT_EQ(txin.GetSequence(), exp_sequence);
    EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
    EXPECT_STREQ(txin.GetUnlockingScript().GetHex().c_str(),
                 exp_script.GetHex().c_str());
  }
}